

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

MCALabelSubDescriptor * __thiscall
ASDCP::MXF::MCALabelSubDescriptor::InitFromTLVSet(MCALabelSubDescriptor *this,TLVReader *TLVSet)

{
  bool bVar1;
  int iVar2;
  MDDEntry *pMVar3;
  MDDEntry *pMVar4;
  MDDEntry *in_RDX;
  TLVReader local_5e8;
  TLVReader local_580;
  TLVReader local_518;
  TLVReader local_4b0;
  TLVReader local_448;
  TLVReader local_3e0;
  TLVReader local_378;
  TLVReader local_310;
  TLVReader local_2a8;
  TLVReader local_240;
  TLVReader local_1d8;
  TLVReader local_170;
  TLVReader local_108;
  TLVReader local_a0;
  undefined1 local_21;
  MDDEntry *local_20;
  TLVReader *TLVSet_local;
  MCALabelSubDescriptor *this_local;
  Result_t *result;
  
  TLVSet_local = TLVSet;
  this_local = this;
  if (TLVSet[1].super_MemIOReader.m_p == (byte_t *)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                  ,0xea7,
                  "virtual ASDCP::Result_t ASDCP::MXF::MCALabelSubDescriptor::InitFromTLVSet(TLVReader &)"
                 );
  }
  local_21 = 0;
  local_20 = in_RDX;
  InterchangeObject::InitFromTLVSet(&this->super_InterchangeObject,TLVSet);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MCALabelSubDescriptor_MCALabelDictionaryID);
    TLVReader::ReadObject(&local_a0,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_a0);
    Kumu::Result_t::~Result_t((Result_t *)&local_a0);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MCALabelSubDescriptor_MCALinkID);
    TLVReader::ReadObject(&local_108,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_108);
    Kumu::Result_t::~Result_t((Result_t *)&local_108);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MCALabelSubDescriptor_MCATagSymbol);
    TLVReader::ReadObject(&local_170,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_170);
    Kumu::Result_t::~Result_t((Result_t *)&local_170);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MCALabelSubDescriptor_MCATagName);
    optional_property<ASDCP::MXF::UTF16String>::get
              ((optional_property<ASDCP::MXF::UTF16String> *)
               &TLVSet[3].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
    TLVReader::ReadObject(&local_1d8,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_1d8);
    Kumu::Result_t::~Result_t((Result_t *)&local_1d8);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<ASDCP::MXF::UTF16String>::set_has_value
              ((optional_property<ASDCP::MXF::UTF16String> *)
               &TLVSet[3].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right,bVar1);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MCALabelSubDescriptor_MCAChannelID);
    optional_property<unsigned_int>::get
              ((optional_property<unsigned_int> *)
               &TLVSet[4].m_ElementMap._M_t._M_impl.super__Rb_tree_header);
    TLVReader::ReadUi32(&local_240,pMVar4,(ui32_t *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_240);
    Kumu::Result_t::~Result_t((Result_t *)&local_240);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<unsigned_int>::set_has_value
              ((optional_property<unsigned_int> *)
               &TLVSet[4].m_ElementMap._M_t._M_impl.super__Rb_tree_header,bVar1);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MCALabelSubDescriptor_RFC5646SpokenLanguage);
    optional_property<ASDCP::MXF::ISO8String>::get
              ((optional_property<ASDCP::MXF::ISO8String> *)
               &TLVSet[4].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    TLVReader::ReadObject(&local_2a8,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_2a8);
    Kumu::Result_t::~Result_t((Result_t *)&local_2a8);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<ASDCP::MXF::ISO8String>::set_has_value
              ((optional_property<ASDCP::MXF::ISO8String> *)
               &TLVSet[4].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,bVar1)
    ;
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MCALabelSubDescriptor_MCATitle);
    optional_property<ASDCP::MXF::UTF16String>::get
              ((optional_property<ASDCP::MXF::UTF16String> *)&TLVSet[5].super_MemIOReader.m_capacity
              );
    TLVReader::ReadObject(&local_310,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_310);
    Kumu::Result_t::~Result_t((Result_t *)&local_310);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<ASDCP::MXF::UTF16String>::set_has_value
              ((optional_property<ASDCP::MXF::UTF16String> *)&TLVSet[5].super_MemIOReader.m_capacity
               ,bVar1);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MCALabelSubDescriptor_MCATitleVersion);
    optional_property<ASDCP::MXF::UTF16String>::get
              ((optional_property<ASDCP::MXF::UTF16String> *)
               &TLVSet[5].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    TLVReader::ReadObject(&local_378,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_378);
    Kumu::Result_t::~Result_t((Result_t *)&local_378);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<ASDCP::MXF::UTF16String>::set_has_value
              ((optional_property<ASDCP::MXF::UTF16String> *)
               &TLVSet[5].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_node_count,bVar1);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MCALabelSubDescriptor_MCATitleSubVersion);
    optional_property<ASDCP::MXF::UTF16String>::get
              ((optional_property<ASDCP::MXF::UTF16String> *)
               &TLVSet[6].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    TLVReader::ReadObject(&local_3e0,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_3e0);
    Kumu::Result_t::~Result_t((Result_t *)&local_3e0);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<ASDCP::MXF::UTF16String>::set_has_value
              ((optional_property<ASDCP::MXF::UTF16String> *)
               &TLVSet[6].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,bVar1)
    ;
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MCALabelSubDescriptor_MCAEpisode);
    optional_property<ASDCP::MXF::UTF16String>::get
              ((optional_property<ASDCP::MXF::UTF16String> *)&TLVSet[7].super_MemIOReader.m_capacity
              );
    TLVReader::ReadObject(&local_448,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_448);
    Kumu::Result_t::~Result_t((Result_t *)&local_448);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<ASDCP::MXF::UTF16String>::set_has_value
              ((optional_property<ASDCP::MXF::UTF16String> *)&TLVSet[7].super_MemIOReader.m_capacity
               ,bVar1);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MCALabelSubDescriptor_MCAPartitionKind);
    optional_property<ASDCP::MXF::UTF16String>::get
              ((optional_property<ASDCP::MXF::UTF16String> *)
               &TLVSet[7].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    TLVReader::ReadObject(&local_4b0,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_4b0);
    Kumu::Result_t::~Result_t((Result_t *)&local_4b0);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<ASDCP::MXF::UTF16String>::set_has_value
              ((optional_property<ASDCP::MXF::UTF16String> *)
               &TLVSet[7].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_node_count,bVar1);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MCALabelSubDescriptor_MCAPartitionNumber);
    optional_property<ASDCP::MXF::UTF16String>::get
              ((optional_property<ASDCP::MXF::UTF16String> *)
               &TLVSet[8].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    TLVReader::ReadObject(&local_518,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_518);
    Kumu::Result_t::~Result_t((Result_t *)&local_518);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<ASDCP::MXF::UTF16String>::set_has_value
              ((optional_property<ASDCP::MXF::UTF16String> *)
               &TLVSet[8].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,bVar1)
    ;
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MCALabelSubDescriptor_MCAAudioContentKind);
    optional_property<ASDCP::MXF::UTF16String>::get
              ((optional_property<ASDCP::MXF::UTF16String> *)&TLVSet[9].super_MemIOReader.m_capacity
              );
    TLVReader::ReadObject(&local_580,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_580);
    Kumu::Result_t::~Result_t((Result_t *)&local_580);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<ASDCP::MXF::UTF16String>::set_has_value
              ((optional_property<ASDCP::MXF::UTF16String> *)&TLVSet[9].super_MemIOReader.m_capacity
               ,bVar1);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar2) {
    pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_MCALabelSubDescriptor_MCAAudioElementKind);
    optional_property<ASDCP::MXF::UTF16String>::get
              ((optional_property<ASDCP::MXF::UTF16String> *)
               &TLVSet[9].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    TLVReader::ReadObject(&local_5e8,local_20,(IArchive *)pMVar4);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_5e8);
    Kumu::Result_t::~Result_t((Result_t *)&local_5e8);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<ASDCP::MXF::UTF16String>::set_has_value
              ((optional_property<ASDCP::MXF::UTF16String> *)
               &TLVSet[9].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_node_count,bVar1);
  }
  return this;
}

Assistant:

ASDCP::Result_t
MCALabelSubDescriptor::InitFromTLVSet(TLVReader& TLVSet)
{
  assert(m_Dict);
  Result_t result = InterchangeObject::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(MCALabelSubDescriptor, MCALabelDictionaryID));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(MCALabelSubDescriptor, MCALinkID));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(MCALabelSubDescriptor, MCATagSymbol));
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(MCALabelSubDescriptor, MCATagName));
    MCATagName.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi32(OBJ_READ_ARGS_OPT(MCALabelSubDescriptor, MCAChannelID));
    MCAChannelID.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(MCALabelSubDescriptor, RFC5646SpokenLanguage));
    RFC5646SpokenLanguage.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(MCALabelSubDescriptor, MCATitle));
    MCATitle.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(MCALabelSubDescriptor, MCATitleVersion));
    MCATitleVersion.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(MCALabelSubDescriptor, MCATitleSubVersion));
    MCATitleSubVersion.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(MCALabelSubDescriptor, MCAEpisode));
    MCAEpisode.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(MCALabelSubDescriptor, MCAPartitionKind));
    MCAPartitionKind.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(MCALabelSubDescriptor, MCAPartitionNumber));
    MCAPartitionNumber.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(MCALabelSubDescriptor, MCAAudioContentKind));
    MCAAudioContentKind.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(MCALabelSubDescriptor, MCAAudioElementKind));
    MCAAudioElementKind.set_has_value( result == RESULT_OK );
  }
  return result;
}